

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeGetNumRhsEvals(void *cvode_mem,long *nfevals)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumRhsEvals","cvode_mem = NULL illegal.");
  }
  else {
    *nfevals = *(long *)((long)cvode_mem + 0x360);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumRhsEvals(void *cvode_mem, long int *nfevals)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetNumRhsEvals", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *nfevals = cv_mem->cv_nfe;

  return(CV_SUCCESS);
}